

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O2

void funnelsort<16u,buffer_layout_bfs>(uchar **strings,size_t n,uchar **tmp)

{
  size_t n_00;
  unsigned_long uVar1;
  unsigned_long uVar2;
  int iVar3;
  ostream *poVar4;
  size_t depth;
  uchar **ppuVar5;
  undefined8 *puVar6;
  long lVar7;
  undefined8 *puVar8;
  fill<16U,_2U,_buffer_layout_bfs> local_c51;
  DI __d;
  array<unsigned_long,_16UL> buffer_count;
  array<Stream,_16UL> streams;
  array<unsigned_char_*,_336UL> buffers;
  
  poVar4 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"funnelsort");
  poVar4 = std::operator<<(poVar4,"(), n=");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4,"\n");
  if (n < 0x20) {
    insertion_sort(strings,(int)n,depth);
    return;
  }
  streams._M_elems[0].n = n >> 4;
  streams._M_elems[0].stream = strings;
  ppuVar5 = strings + streams._M_elems[0].n;
  for (lVar7 = 0x18; lVar7 != 0xf8; lVar7 = lVar7 + 0x10) {
    *(uchar ***)((long)buffer_count._M_elems + lVar7 + 0x78) = ppuVar5;
    *(size_t *)((long)&streams._M_elems[0].stream + lVar7) = streams._M_elems[0].n;
    ppuVar5 = ppuVar5 + streams._M_elems[0].n;
  }
  streams._M_elems[0xf].stream = streams._M_elems[0xe].stream + streams._M_elems[0].n;
  streams._M_elems[0xf].n = streams._M_elems[0].n * -0xf + n;
  for (lVar7 = 8; lVar7 != 0x108; lVar7 = lVar7 + 0x10) {
    ppuVar5 = *(uchar ***)((long)buffer_count._M_elems + lVar7 + 0x78);
    n_00 = *(size_t *)((long)&streams._M_elems[0].stream + lVar7);
    funnelsort<8u,buffer_layout_bfs>(ppuVar5,n_00,tmp);
    check_input(ppuVar5,n_00);
  }
  buffers._M_elems[0] = (uchar *)0x0;
  std::array<unsigned_long,_16UL>::fill(&buffer_count,(value_type_conflict *)&buffers);
  poVar4 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"fill_root");
  std::operator<<(poVar4,", root\n");
  __d.i = &__debug_indent_str_abi_cxx11_;
  std::__cxx11::string::append((char *)&__debug_indent_str_abi_cxx11_);
  ppuVar5 = tmp;
  while( true ) {
    if ((buffer_count._M_elems[2] == 0) &&
       (fill<16U,_2U,_buffer_layout_bfs>::operator()
                  (&local_c51,&streams,buffers._M_elems,&buffer_count),
       buffer_count._M_elems[2] == 0)) {
      poVar4 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
      std::operator<<(poVar4,"left stream drained\n");
      if (buffer_count._M_elems[2] != 0) {
        __assert_fail("buffer_count[2] == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                      ,0x238,
                      "void fill_root(std::array<Stream, K> &__restrict, unsigned char **__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict) [K = 16U, BufferLayout = buffer_layout_bfs]"
                     );
      }
      if (buffer_count._M_elems[3] == 0) {
        __assert_fail("buffer_count[3] != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                      ,0x239,
                      "void fill_root(std::array<Stream, K> &__restrict, unsigned char **__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict) [K = 16U, BufferLayout = buffer_layout_bfs]"
                     );
      }
      while (uVar1 = buffer_count._M_elems[3], buffer_count._M_elems[3] != 0) {
        if (buffer_count._M_elems[3] * 8 != 0) {
          memcpy(ppuVar5,(void *)((long)&buffers + buffer_count._M_elems[3] * -8 + 0x80),
                 buffer_count._M_elems[3] * 8);
        }
        buffer_count._M_elems[3] = 0;
        fill<16U,_3U,_buffer_layout_bfs>::operator()
                  ((fill<16U,_3U,_buffer_layout_bfs> *)&local_c51,&streams,buffers._M_elems,
                   &buffer_count);
        ppuVar5 = ppuVar5 + uVar1;
      }
      goto LAB_00123798;
    }
    if ((buffer_count._M_elems[3] == 0) &&
       (fill<16U,_3U,_buffer_layout_bfs>::operator()
                  ((fill<16U,_3U,_buffer_layout_bfs> *)&local_c51,&streams,buffers._M_elems,
                   &buffer_count), buffer_count._M_elems[3] == 0)) break;
    uVar2 = buffer_count._M_elems[3];
    uVar1 = buffer_count._M_elems[2];
    poVar4 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,"L:\'");
    puVar8 = (undefined8 *)((long)&buffers + (8 - uVar1) * 8);
    poVar4 = std::operator<<(poVar4,(char *)*puVar8);
    poVar4 = std::operator<<(poVar4,"\', R:\'");
    puVar6 = (undefined8 *)((long)&buffers + (8 - uVar2) * 8 + 0x40);
    poVar4 = std::operator<<(poVar4,(char *)*puVar6);
    std::operator<<(poVar4,"\'\n");
    iVar3 = cmp((void *)*puVar8,(void *)*puVar6);
    if (iVar3 < 1) {
      puVar6 = puVar8;
    }
    buffer_count._M_elems[(ulong)(0 < iVar3) + 2] =
         buffer_count._M_elems[(ulong)(0 < iVar3) + 2] - 1;
    *ppuVar5 = (uchar *)*puVar6;
    ppuVar5 = ppuVar5 + 1;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  std::operator<<(poVar4,"right stream drained\n");
  if (buffer_count._M_elems[2] == 0) {
    __assert_fail("buffer_count[2] != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                  ,0x247,
                  "void fill_root(std::array<Stream, K> &__restrict, unsigned char **__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict) [K = 16U, BufferLayout = buffer_layout_bfs]"
                 );
  }
  if (buffer_count._M_elems[3] != 0) {
    __assert_fail("buffer_count[3] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                  ,0x248,
                  "void fill_root(std::array<Stream, K> &__restrict, unsigned char **__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict) [K = 16U, BufferLayout = buffer_layout_bfs]"
                 );
  }
  while (uVar1 = buffer_count._M_elems[2], buffer_count._M_elems[2] != 0) {
    memcpy(ppuVar5,(void *)((long)&buffers + buffer_count._M_elems[2] * -8 + 0x40),
           buffer_count._M_elems[2] * 8);
    buffer_count._M_elems[2] = 0;
    fill<16U,_2U,_buffer_layout_bfs>::operator()(&local_c51,&streams,buffers._M_elems,&buffer_count)
    ;
    ppuVar5 = ppuVar5 + uVar1;
  }
LAB_00123798:
  anon_func::DI::~DI(&__d);
  memcpy(strings,tmp,n * 8);
  check_input(strings,n);
  return;
}

Assistant:

static void
funnelsort(unsigned char** strings, size_t n, unsigned char** restrict tmp)
{
	debug() << __func__ << "(), n=" << n << "\n";
	if (n < 32) {
		insertion_sort(strings, n, 0);
		return;
	}
	size_t splitter = n/K;
	std::array<Stream, K> streams;
	streams[0].stream = strings;
	streams[0].n      = splitter;
	for (unsigned i=1; i < K-1; ++i) {
		streams[i].stream = streams[i-1].stream + splitter;
		streams[i].n = splitter;
	}
	streams[K-1].stream = streams[K-2].stream + splitter;
	streams[K-1].n      = n - (K-1)*splitter;
	for (unsigned i=0; i < K; ++i) {
		funnelsort<(K>16?K/4:K/2),BufferLayout>(streams[i].stream,
		                                        streams[i].n, tmp);
		check_input(streams[i].stream, streams[i].n);
	}
	std::array<unsigned char*, buffer_total_size<K>::value> buffers;
	std::array<size_t, K> buffer_count;
	buffer_count.fill(0);
	fill_root<K,BufferLayout>(streams,tmp,buffers.data(),buffer_count);
	(void) memcpy(strings, tmp, n*sizeof(unsigned char*));
	check_input(strings, n);
}